

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O3

ByteArray *
ZXing::DataMatrix::Encode
          (ByteArray *__return_storage_ptr__,wstring *msg,CharacterSet charset,SymbolShape shape,
          int minWidth,int minHeight,int maxWidth,int maxHeight)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  code *pcVar4;
  pointer __dest;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined4 uVar9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint8_t codeword;
  int iVar10;
  string *msg_00;
  SymbolInfo *pSVar11;
  void *__src;
  invalid_argument *piVar12;
  int iVar13;
  undefined7 in_register_00000011;
  wstring *str;
  long lVar14;
  ulong uVar15;
  ByteArray *__range4;
  uint uVar16;
  int iVar17;
  string *psVar18;
  size_t __n;
  char cVar19;
  undefined8 uVar20;
  byte *pbVar21;
  byte *pbVar22;
  size_t __n_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str_01;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str_02;
  undefined1 auVar23 [12];
  string buffer;
  EncoderContext context;
  _Any_data local_108;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  SymbolShape local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_90;
  undefined4 uStack_8c;
  int local_88;
  undefined4 uStack_84;
  long local_80;
  int local_78;
  uint local_74;
  undefined8 local_70;
  int local_68;
  ulong local_60;
  string local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  str = (wstring *)(CONCAT71(in_register_00000011,charset) & 0xffffffff);
  if ((int)CONCAT71(in_register_00000011,charset) == 0) {
    str = (wstring *)0x2;
  }
  local_38 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  TextEncoder::FromUnicode((string *)&local_108,(TextEncoder *)msg,str,(CharacterSet)shape);
  EncoderContext::EncoderContext((EncoderContext *)&local_c8,(string *)&local_108);
  if ((undefined1 *)local_108._M_unused._0_8_ != local_f8) {
    operator_delete(local_108._M_unused._M_object,(ulong)(local_f8._0_8_ + 1));
  }
  local_9c = maxWidth;
  local_98 = maxHeight;
  local_108._8_8_ = (msg->_M_dataplus)._M_p;
  local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
  local_a8 = shape;
  local_a4 = minWidth;
  local_a0 = minHeight;
  if (local_108._M_unused._M_object <
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x8) goto LAB_00156447;
  __str._M_str = L"[)>\x1e05\x1d";
  __str._M_len = 7;
  iVar10 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,0,7,__str
                     );
  local_108._8_8_ = (msg->_M_dataplus)._M_p;
  local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
  if (iVar10 == 0) {
    if (local_108._M_unused._M_object <
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x3) goto LAB_00156447;
    __str_02._M_str = L"\x1e\x04";
    __str_02._M_len = 2;
    iVar10 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,
                        (size_type)(local_108._M_unused._M_member_pointer + -2),2,__str_02);
    if (iVar10 != 0) {
      local_108._8_8_ = (msg->_M_dataplus)._M_p;
      local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
      goto LAB_00156364;
    }
    EncoderContext::addCodeword((EncoderContext *)&local_c8,0xec);
  }
  else {
LAB_00156364:
    if ((local_108._M_unused._M_object <
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x8) ||
       (__str_00._M_str = L"[)>\x1e06\x1d", __str_00._M_len = 7,
       iVar10 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,0,7,
                           __str_00), iVar10 != 0)) goto LAB_00156447;
    local_108._8_8_ = (msg->_M_dataplus)._M_p;
    local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
    if ((local_108._M_unused._M_object <
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3) ||
       (__str_01._M_str = L"\x1e\x04", __str_01._M_len = 2,
       iVar10 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,
                           (size_type)(local_108._M_unused._M_member_pointer + -2),2,__str_01),
       iVar10 != 0)) goto LAB_00156447;
    EncoderContext::addCodeword((EncoderContext *)&local_c8,0xed);
  }
  local_68 = 2;
  local_78 = 7;
LAB_00156447:
  msg_00 = (string *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  uVar15 = 0;
  if (local_78 < local_c8._8_4_ - local_68) {
    uVar15 = 0;
    do {
      cVar19 = (char)&local_e8;
      switch(uVar15 & 0xffffffff) {
      case 0:
        psVar18 = (string *)(long)local_78;
        pbVar1 = (byte *)((long)&(psVar18->_M_dataplus)._M_p + local_c8._M_allocated_capacity);
        lVar14 = (long)msg_00 - (long)psVar18 >> 2;
        pbVar22 = pbVar1;
        if (0 < lVar14) {
          pbVar22 = (byte *)((char *)(((long)msg_00 - (long)psVar18 & 0xfffffffffffffffcU) +
                                     local_c8._M_allocated_capacity) + (long)psVar18);
          lVar14 = lVar14 + 1;
          pbVar21 = (byte *)((char *)(local_c8._M_allocated_capacity + 1) +
                            (long)&(psVar18->_M_dataplus)._M_p);
          do {
            if (9 < (int)(char)pbVar21[-1] - 0x30U) {
              pbVar21 = pbVar21 + -1;
              goto LAB_00156c6b;
            }
            if (9 < (int)(char)*pbVar21 - 0x30U) goto LAB_00156c6b;
            if (9 < (int)(char)pbVar21[1] - 0x30U) {
              pbVar21 = pbVar21 + 1;
              goto LAB_00156c6b;
            }
            if (9 < (int)(char)pbVar21[2] - 0x30U) {
              pbVar21 = pbVar21 + 2;
              goto LAB_00156c6b;
            }
            lVar14 = lVar14 + -1;
            pbVar21 = pbVar21 + 4;
          } while (1 < lVar14);
        }
        pbVar2 = (byte *)((long)&(msg_00->_M_dataplus)._M_p + local_c8._M_allocated_capacity);
        lVar14 = (long)pbVar2 - (long)pbVar22;
        if (lVar14 == 1) {
LAB_00156569:
          pbVar21 = pbVar2;
          if (9 < (int)(char)*pbVar22 - 0x30U) {
            pbVar21 = pbVar22;
          }
        }
        else {
          pbVar21 = pbVar22;
          if (lVar14 == 2) {
LAB_00156554:
            if ((int)(char)*pbVar21 - 0x30U < 10) {
              pbVar22 = pbVar21 + 1;
              goto LAB_00156569;
            }
          }
          else {
            pbVar21 = pbVar2;
            if ((lVar14 == 3) && (pbVar21 = pbVar22, (int)(char)*pbVar22 - 0x30U < 10)) {
              pbVar21 = pbVar22 + 1;
              goto LAB_00156554;
            }
          }
        }
LAB_00156c6b:
        if ((int)pbVar21 - (int)pbVar1 < 2) {
          if (msg_00 <= psVar18) {
LAB_00156fb3:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",psVar18
                       ,msg_00);
          }
          cVar19 = *(char *)((long)&(psVar18->_M_dataplus)._M_p + local_c8._M_allocated_capacity);
          uVar16 = LookAheadTest((DataMatrix *)local_c8._M_allocated_capacity,msg_00,(size_t)psVar18
                                 ,0);
          if (uVar16 == 0) {
            if (cVar19 < '\0') {
              EncoderContext::addCodeword((EncoderContext *)&local_c8,0xeb);
              EncoderContext::addCodeword((EncoderContext *)&local_c8,cVar19 + 0x81);
            }
            else {
              EncoderContext::addCodeword((EncoderContext *)&local_c8,cVar19 + '\x01');
            }
            local_78 = local_78 + 1;
          }
          else {
            EncoderContext::addCodeword
                      ((EncoderContext *)&local_c8,*(uint8_t *)((long)&LATCHES + (ulong)uVar16));
            local_74 = uVar16;
          }
        }
        else {
          if ((msg_00 <= psVar18) || (psVar18 = (string *)((long)local_78 + 1), msg_00 <= psVar18))
          goto LAB_00156fb3;
          bVar3 = *(byte *)((long)&(psVar18->_M_dataplus)._M_p + local_c8._M_allocated_capacity);
          codeword = *pbVar1 * '\n' + bVar3 + 'r';
          if (9 < bVar3 - 0x30) {
            codeword = '?';
          }
          if (9 < *pbVar1 - 0x30) {
            codeword = '?';
          }
          EncoderContext::addCodeword((EncoderContext *)&local_c8,codeword);
          local_78 = local_78 + 2;
        }
        break;
      case 1:
        local_108._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_108._M_unused._M_object = C40Encoder::EncodeChar;
        local_f8._8_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
        local_f8._0_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
        C40Encoder::EncodeC40
                  ((EncoderContext *)&local_c8,
                   (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_108,1);
        if ((code *)local_f8._0_8_ != (code *)0x0) {
          (*(code *)local_f8._0_8_)(&local_108,&local_108,3);
        }
        break;
      case 2:
        local_108._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_108._M_unused._M_object = DMTextEncoder::EncodeChar;
        local_f8._8_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
        local_f8._0_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
        C40Encoder::EncodeC40
                  ((EncoderContext *)&local_c8,
                   (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_108,2);
        if ((code *)local_f8._0_8_ != (code *)0x0) {
          (*(code *)local_f8._0_8_)(&local_108,&local_108,3);
        }
        break;
      case 3:
        local_e8._M_allocated_capacity = (size_type)&local_d8;
        local_e8._8_8_ = 0;
        local_d8._M_local_buf[0] = '\0';
        do {
          psVar18 = (string *)(long)local_78;
          if (msg_00 <= psVar18) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",psVar18
                       ,msg_00);
          }
          bVar3 = *(byte *)((long)&(psVar18->_M_dataplus)._M_p + local_c8._M_allocated_capacity);
          local_78 = local_78 + 1;
          uVar16 = (uint)bVar3;
          if (bVar3 < 0x2a) {
            if ((uVar16 != 0xd) && (uVar16 != 0x20)) {
LAB_001567e2:
              if ((9 < bVar3 - 0x30) && (0x19 < bVar3 - 0x41)) {
                auVar23 = __cxa_allocate_exception(0x10);
                ToHexString_abi_cxx11_(&local_58,(DataMatrix *)(ulong)uVar16,auVar23._8_4_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_108,"Illegal character: ",&local_58);
                std::invalid_argument::invalid_argument(auVar23._0_8_,(string *)&local_108);
                __cxa_throw(auVar23._0_8_,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
            }
          }
          else if ((bVar3 != 0x3e) && (uVar16 != 0x2a)) goto LAB_001567e2;
          std::__cxx11::string::push_back(cVar19);
          if ((ulong)(local_e8._8_8_ * -0x5555555555555555) < 0x5555555555555556) {
            C40Encoder::WriteNextTriplet((EncoderContext *)&local_c8,(string *)&local_e8);
            iVar10 = LookAheadTest((DataMatrix *)local_c8._M_allocated_capacity,
                                   (string *)CONCAT44(local_c8._12_4_,local_c8._8_4_),(long)local_78
                                   ,3);
            if (iVar10 != 3) {
              local_74 = 0;
              break;
            }
          }
          msg_00 = (string *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        } while (local_78 < local_c8._8_4_ - local_68);
        iVar10 = local_88 - local_90;
        pSVar11 = EncoderContext::updateSymbolInfo((EncoderContext *)&local_c8,iVar10);
        local_78 = local_78 - local_e8._8_4_;
        iVar17 = local_c8._8_4_ - (local_78 + local_68);
        if (((1 < iVar17) || (iVar10 = pSVar11->_dataCapacity - iVar10, 1 < iVar10)) ||
           (iVar17 != iVar10)) {
          EncoderContext::addCodeword((EncoderContext *)&local_c8,0xfe);
        }
        if ((int)local_74 < 0) goto LAB_00156c32;
        goto LAB_00156c3d;
      case 4:
        local_e8._M_allocated_capacity = (size_type)&local_d8;
        local_e8._8_8_ = 0;
        local_d8._M_local_buf[0] = '\0';
        do {
          if (local_c8._8_4_ - local_68 <= local_78) break;
          if (CONCAT44(local_c8._12_4_,local_c8._8_4_) <= (ulong)(long)local_78) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar3 = *(byte *)(local_c8._M_allocated_capacity + (long)local_78);
          if (((bVar3 & 0xffffffe0) != 0x20) && (0x1e < bVar3 - 0x40)) {
            auVar23 = __cxa_allocate_exception(0x10);
            ToHexString_abi_cxx11_(&local_58,(DataMatrix *)(ulong)bVar3,auVar23._8_4_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108,"Illegal character: ",&local_58);
            std::invalid_argument::invalid_argument(auVar23._0_8_,(string *)&local_108);
            __cxa_throw(auVar23._0_8_,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::push_back(cVar19);
          local_78 = local_78 + 1;
          if ((ulong)local_e8._8_8_ < 4) {
LAB_00156693:
            iVar17 = 0;
          }
          else {
            EdifactEncoder::EncodeToCodewords
                      ((ByteArray *)&local_108,(string *)local_e8._M_allocated_capacity,
                       (int)local_e8._8_8_);
            uVar6 = local_108._8_8_;
            for (uVar20 = local_108._M_unused._0_8_; uVar20 != uVar6; uVar20 = uVar20 + 1) {
              EncoderContext::addCodeword((EncoderContext *)&local_c8,*(uint8_t *)uVar20);
            }
            std::__cxx11::string::erase((ulong)&local_e8,0);
            iVar10 = LookAheadTest((DataMatrix *)local_c8._M_allocated_capacity,
                                   (string *)CONCAT44(local_c8._12_4_,local_c8._8_4_),(long)local_78
                                   ,4);
            iVar17 = 0;
            if (iVar10 != 4) {
              local_74 = 0;
              iVar17 = 3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_unused._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_108._M_unused._M_object,local_f8._0_8_ - local_108._0_8_);
            }
            if (iVar10 == 4) goto LAB_00156693;
          }
        } while (iVar17 == 0);
        std::__cxx11::string::push_back(cVar19);
        uVar20 = local_e8._8_8_;
        if (local_e8._8_8_ == 0) goto LAB_00156c3d;
        if (local_e8._8_8_ == 1) {
          iVar17 = local_88 - local_90;
          pSVar11 = EncoderContext::updateSymbolInfo((EncoderContext *)&local_c8,iVar17);
          iVar10 = pSVar11->_dataCapacity - iVar17;
          iVar13 = local_c8._8_4_ - (local_68 + local_78);
          if (iVar10 < iVar13) {
            pSVar11 = EncoderContext::updateSymbolInfo((EncoderContext *)&local_c8,iVar17 + 1);
            iVar10 = pSVar11->_dataCapacity - iVar17;
          }
          if ((iVar13 <= iVar10) && (iVar10 < 3)) goto LAB_00156c3d;
        }
        else if (4 < (ulong)local_e8._8_8_) {
          piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar12,"Count must not exceed 4");
          __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        local_60 = uVar15;
        EdifactEncoder::EncodeToCodewords
                  ((ByteArray *)&local_108,(string *)local_e8._M_allocated_capacity,
                   (int)local_e8._8_8_);
        bVar5 = local_78 < local_c8._8_4_ - local_68;
        uVar6 = local_108._M_unused._0_8_;
        uVar7 = local_108._8_8_;
        uVar8 = local_60;
        if (3 < (ulong)uVar20) {
joined_r0x00156bf0:
          for (; uVar15 = local_60, uVar20 = local_108._8_8_, bVar5 = uVar6 != local_108._8_8_,
              local_108._8_8_ = uVar7, local_60 = uVar8, bVar5; uVar6 = (uint8_t *)(uVar6 + 1)) {
            EncoderContext::addCodeword((EncoderContext *)&local_c8,*(uint8_t *)uVar6);
            uVar7 = local_108._8_8_;
            uVar8 = local_60;
            local_60 = uVar15;
            local_108._8_8_ = uVar20;
          }
        }
        else {
          iVar10 = (int)uVar20 + -1;
          iVar17 = local_88 - local_90;
          pSVar11 = EncoderContext::updateSymbolInfo((EncoderContext *)&local_c8,iVar17 + iVar10);
          if (2 < pSVar11->_dataCapacity - iVar17) {
            EncoderContext::updateSymbolInfo
                      ((EncoderContext *)&local_c8,(local_108._8_4_ - local_108._0_4_) + iVar17);
            uVar6 = local_108._M_unused._0_8_;
            uVar7 = local_108._8_8_;
            uVar8 = local_60;
            goto joined_r0x00156bf0;
          }
          uVar6 = local_108._M_unused._0_8_;
          uVar7 = local_108._8_8_;
          uVar8 = local_60;
          if (3 < (ulong)uVar20 || bVar5) goto joined_r0x00156bf0;
          local_70 = 0;
          local_78 = local_78 - iVar10;
          uVar15 = local_60;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_108._M_unused._M_object,local_f8._0_8_ - local_108._0_8_);
        }
LAB_00156c32:
        local_74 = 0;
LAB_00156c3d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_allocated_capacity != &local_d8) {
          uVar20 = local_e8._M_allocated_capacity;
          pcVar4 = (code *)CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
LAB_00156c58:
          operator_delete((void *)uVar20,(ulong)(pcVar4 + 1));
        }
        break;
      case 5:
        local_108._M_unused._M_object = local_f8;
        local_108._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
        std::__cxx11::string::push_back((char)&local_108);
        do {
          if (local_c8._8_4_ - local_68 <= local_78) goto LAB_00156977;
          if (CONCAT44(local_c8._12_4_,local_c8._8_4_) <= (ulong)(long)local_78) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          std::__cxx11::string::push_back((char)&local_108);
          lVar14 = (long)local_78;
          local_78 = (int)(lVar14 + 1U);
          iVar10 = LookAheadTest((DataMatrix *)local_c8._M_allocated_capacity,
                                 (string *)CONCAT44(local_c8._12_4_,local_c8._8_4_),lVar14 + 1U,5);
        } while (iVar10 == 5);
        local_74 = 0;
LAB_00156977:
        uVar9 = local_108._8_4_;
        iVar10 = (local_88 - local_90) + local_108._8_4_;
        pSVar11 = EncoderContext::updateSymbolInfo((EncoderContext *)&local_c8,iVar10);
        if ((iVar10 < pSVar11->_dataCapacity) || (local_78 < local_c8._8_4_ - local_68)) {
          uVar16 = uVar9 - 1;
          if ((int)uVar9 < 0xfb) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
LAB_00156fc7:
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
            }
            *local_108._M_unused._M_function_pointer = (_func_void)(uint8_t)uVar16;
          }
          else {
            if (0x614 < (uint)uVar9) {
              piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string((string *)&local_e8,uVar16);
              std::operator+(&local_58,"Message length not in valid ranges: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e8);
              std::invalid_argument::invalid_argument(piVar12,(string *)&local_58);
              __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_00156fc7;
            *local_108._M_unused._M_function_pointer =
                 (_func_void)((char)((uVar16 & 0xffff) / 0xfa) + 0xf9);
            std::__cxx11::string::insert((ulong)&local_108,1,'\x01');
          }
        }
        uVar6 = local_108._8_8_;
        uVar20 = local_108._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          lVar14 = 0;
          do {
            iVar10 = (local_88 - local_90) * 0x95;
            iVar17 = (int)((ulong)((long)(iVar10 + 0x95) * -0x7f7f7f7f) >> 0x20) + iVar10 + 0x95;
            EncoderContext::addCodeword
                      ((EncoderContext *)&local_c8,
                       *(uint8_t *)(uVar20 + lVar14) +
                       (char)iVar10 + ((char)(iVar17 >> 7) - (char)(iVar17 >> 0x1f)) + -0x6a);
            lVar14 = lVar14 + 1;
          } while (uVar6 != lVar14);
        }
        uVar20 = local_108._M_unused._0_8_;
        pcVar4 = (code *)local_f8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_unused._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8) break;
        goto LAB_00156c58;
      }
      uVar16 = local_74;
      if (-1 < (int)local_74) {
        local_74 = 0xffffffff;
        uVar15 = (ulong)uVar16;
      }
      msg_00 = (string *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    } while (local_78 < local_c8._8_4_ - local_68);
  }
  iVar17 = local_88 - local_90;
  pSVar11 = EncoderContext::updateSymbolInfo((EncoderContext *)&local_c8,iVar17);
  this = local_38;
  iVar10 = pSVar11->_dataCapacity;
  if ((iVar17 < iVar10) && ((5 < (uint)uVar15 || ((0x31U >> ((uint)uVar15 & 0x1f) & 1) == 0)))) {
    EncoderContext::addCodeword((EncoderContext *)&local_c8,0xfe);
  }
  if (local_88 - local_90 < iVar10) {
    EncoderContext::addCodeword((EncoderContext *)&local_c8,0x81);
  }
  while( true ) {
    __n = CONCAT44(uStack_84,local_88) - CONCAT44(uStack_8c,local_90);
    iVar17 = (int)__n;
    if (iVar10 <= iVar17) break;
    iVar17 = iVar17 * 0x95;
    iVar13 = iVar17 + 0x95;
    iVar17 = iVar17 + (int)((ulong)((long)iVar13 * -0x7e7b7257) >> 0x20) + 0x95;
    iVar13 = iVar13 + ((iVar17 >> 7) - (iVar17 >> 0x1f)) * -0xfd;
    EncoderContext::addCodeword
              ((EncoderContext *)&local_c8,(char)iVar13 + -0x7e + (0x7c < iVar13) * '\x02');
  }
  (this->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage(this,__n);
  __src = (void *)CONCAT44(uStack_8c,local_90);
  __dest = (this->_M_impl).super__Vector_impl_data._M_start;
  __n_00 = CONCAT44(uStack_84,local_88) - (long)__src;
  if (__n_00 != 0) {
    memmove(__dest,__src,__n_00);
    __src = (void *)CONCAT44(uStack_8c,local_90);
  }
  (this->_M_impl).super__Vector_impl_data._M_finish = __dest + __n_00;
  if (__src != (void *)0x0) {
    operator_delete(__src,local_80 - (long)__src);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_allocated_capacity != &local_b8) {
    operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
  }
  return (ByteArray *)this;
}

Assistant:

ByteArray Encode(const std::wstring& msg, CharacterSet charset, SymbolShape shape, int minWidth, int minHeight, int maxWidth, int maxHeight)
{
	//the codewords 0..255 are encoded as Unicode characters
	//Encoder[] encoders = {
	//	new ASCIIEncoder(), new C40Encoder(), new TextEncoder(),
	//	new X12Encoder(), new EdifactEncoder(),  new Base256Encoder()
	//};

	if (charset == CharacterSet::Unknown) {
		charset = CharacterSet::ISO8859_1;
	}

	EncoderContext context(TextEncoder::FromUnicode(msg, charset));
	context.setSymbolShape(shape);
	context.setSizeConstraints(minWidth, minHeight, maxWidth, maxHeight);

	constexpr std::wstring_view MACRO_05_HEADER = L"[)>\x1E""05\x1D";
	constexpr std::wstring_view MACRO_06_HEADER = L"[)>\x1E""06\x1D";
	constexpr std::wstring_view MACRO_TRAILER = L"\x1E\x04";

	if (StartsWith(msg, MACRO_05_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_05);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_05_HEADER));
	}
	else if (StartsWith(msg, MACRO_06_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_06);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_06_HEADER));
	}

	int encodingMode = ASCII_ENCODATION; //Default mode
	while (context.hasMoreCharacters()) {
		switch (encodingMode) {
		case ASCII_ENCODATION:   ASCIIEncoder::EncodeASCII(context);     break;
		case C40_ENCODATION:     C40Encoder::EncodeC40(context);         break;
		case TEXT_ENCODATION:    DMTextEncoder::EncodeText(context);     break;
		case X12_ENCODATION:     X12Encoder::EncodeX12(context);         break;
		case EDIFACT_ENCODATION: EdifactEncoder::EncodeEdifact(context); break;
		case BASE256_ENCODATION: Base256Encoder::EncodeBase256(context); break;
		}
		if (context.newEncoding() >= 0) {
			encodingMode = context.newEncoding();
			context.clearNewEncoding();
		}
	}
	int len = context.codewordCount();
	auto symbolInfo = context.updateSymbolInfo(len);
	int capacity = symbolInfo->dataCapacity();
	if (len < capacity) {
		if (encodingMode != ASCII_ENCODATION && encodingMode != BASE256_ENCODATION && encodingMode != EDIFACT_ENCODATION) {
			context.addCodeword('\xfe'); //Unlatch (254)
		}
	}
	//Padding
	if (context.codewordCount() < capacity) {
		context.addCodeword(PAD);
	}
	while (context.codewordCount() < capacity) {
		context.addCodeword(Randomize253State(PAD, context.codewordCount() + 1));
	}

	return context.codewords();
}